

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Session::Session(Session *this,bool throw_exception)

{
  CURL *pCVar1;
  
  (this->url_)._M_dataplus._M_p = (pointer)&(this->url_).field_2;
  (this->url_)._M_string_length = 0;
  (this->url_).field_2._M_local_buf[0] = '\0';
  (this->proxy_url_)._M_dataplus._M_p = (pointer)&(this->proxy_url_).field_2;
  (this->proxy_url_)._M_string_length = 0;
  (this->proxy_url_).field_2._M_local_buf[0] = '\0';
  (this->token_)._M_dataplus._M_p = (pointer)&(this->token_).field_2;
  (this->token_)._M_string_length = 0;
  (this->token_).field_2._M_local_buf[0] = '\0';
  this->throw_exception_ = throw_exception;
  (this->mutex_request_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_request_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex_request_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_request_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutex_request_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  curl_global_init(3);
  pCVar1 = (CURL *)curl_easy_init();
  this->curl_ = pCVar1;
  return;
}

Assistant:

Session(bool throw_exception) : throw_exception_{throw_exception} {
        curl_global_init(CURL_GLOBAL_ALL);
        curl_ = curl_easy_init();
    }